

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O0

Gia_Man_t *
Abc_NtkFinMiterToGia
          (Abc_Ntk_t *pNtk,Vec_Int_t *vTypes,Vec_Int_t *vCos,Vec_Int_t *vCis,Vec_Int_t *vNodes,
          int *iObjs,int *Types,Vec_Int_t *vLits)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Vec_Int_t *vTemp_00;
  Gia_Man_t *p;
  char *pcVar6;
  Abc_Obj_t *pAVar7;
  int *piVar8;
  Gia_Man_t *pGVar9;
  int local_cc;
  int *pLits;
  int local_68;
  int iLit;
  int iMiter;
  int Type;
  int i;
  int n;
  Vec_Int_t *vTemp;
  Abc_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  int *iObjs_local;
  Vec_Int_t *vNodes_local;
  Vec_Int_t *vCis_local;
  Vec_Int_t *vCos_local;
  Vec_Int_t *vTypes_local;
  Abc_Ntk_t *pNtk_local;
  
  vTemp_00 = Vec_IntAlloc(100);
  p = Gia_ManStart(1000);
  pcVar6 = Abc_UtilStrsav(pNtk->pName);
  p->pName = pcVar6;
  pcVar6 = Abc_UtilStrsav(pNtk->pSpec);
  p->pSpec = pcVar6;
  Gia_ManHashStart(p);
  for (iMiter = 0; iVar1 = Vec_IntSize(vCis), iMiter < iVar1; iMiter = iMiter + 1) {
    iVar1 = Vec_IntEntry(vCis,iMiter);
    pAVar7 = Abc_NtkObj(pNtk,iVar1);
    if (pAVar7 != (Abc_Obj_t *)0x0) {
      iVar1 = Gia_ManAppendCi(p);
      for (Type = 0; Type < 2; Type = Type + 1) {
        uVar4 = iObjs[Type];
        uVar3 = Abc_ObjId(pAVar7);
        if (uVar4 == uVar3) {
          if (Types[Type] == -0x61) {
            uVar4 = Abc_ObjId(pAVar7);
            iVar5 = Abc_Var2Lit(uVar4,Type);
            iVar2 = Abc_LitNot(iVar1);
            Vec_IntWriteEntry(vLits,iVar5,iVar2);
          }
          else {
            uVar4 = Abc_ObjId(pAVar7);
            iVar5 = Abc_Var2Lit(uVar4,Type);
            iVar2 = Abc_NtkFinSimOneLit(p,pAVar7,Types[Type],vLits,Type,vTemp_00);
            Vec_IntWriteEntry(vLits,iVar5,iVar2);
          }
        }
        else {
          uVar4 = Abc_ObjId(pAVar7);
          iVar5 = Abc_Var2Lit(uVar4,Type);
          Vec_IntWriteEntry(vLits,iVar5,iVar1);
        }
      }
    }
  }
  for (iMiter = 0; iVar1 = Vec_IntSize(vNodes), iMiter < iVar1; iMiter = iMiter + 1) {
    iVar1 = Vec_IntEntry(vNodes,iMiter);
    pAVar7 = Abc_NtkObj(pNtk,iVar1);
    if (pAVar7 != (Abc_Obj_t *)0x0) {
      iVar1 = Abc_NtkIsMappedLogic(pNtk);
      if (iVar1 == 0) {
        uVar4 = Abc_ObjId(pAVar7);
        local_cc = Vec_IntEntry(vTypes,uVar4);
      }
      else {
        local_cc = Mio_GateReadCell((Mio_Gate_t *)(pAVar7->field_5).pData);
      }
      for (Type = 0; Type < 2; Type = Type + 1) {
        uVar4 = iObjs[Type];
        uVar3 = Abc_ObjId(pAVar7);
        if (uVar4 == uVar3) {
          if (Types[Type] == -0x61) {
            uVar4 = Abc_ObjId(pAVar7);
            iVar1 = Abc_Var2Lit(uVar4,Type);
            iVar5 = Abc_NtkFinSimOneLit(p,pAVar7,local_cc,vLits,Type,vTemp_00);
            iVar5 = Abc_LitNot(iVar5);
            Vec_IntWriteEntry(vLits,iVar1,iVar5);
          }
          else {
            uVar4 = Abc_ObjId(pAVar7);
            iVar1 = Abc_Var2Lit(uVar4,Type);
            iVar5 = Abc_NtkFinSimOneLit(p,pAVar7,Types[Type],vLits,Type,vTemp_00);
            Vec_IntWriteEntry(vLits,iVar1,iVar5);
          }
        }
        else {
          uVar4 = Abc_ObjId(pAVar7);
          iVar1 = Abc_Var2Lit(uVar4,Type);
          iVar5 = Abc_NtkFinSimOneLit(p,pAVar7,local_cc,vLits,Type,vTemp_00);
          Vec_IntWriteEntry(vLits,iVar1,iVar5);
        }
      }
    }
  }
  local_68 = 0;
  for (iMiter = 0; iVar1 = Vec_IntSize(vCos), iMiter < iVar1; iMiter = iMiter + 1) {
    iVar1 = Vec_IntEntry(vCos,iMiter);
    pAVar7 = Abc_NtkObj(pNtk,iVar1);
    if (pAVar7 != (Abc_Obj_t *)0x0) {
      iVar1 = Abc_ObjFaninId0(pAVar7);
      iVar1 = Abc_Var2Lit(iVar1,0);
      piVar8 = Vec_IntEntryP(vLits,iVar1);
      iVar1 = Gia_ManHashXor(p,*piVar8,piVar8[1]);
      local_68 = Gia_ManHashOr(p,local_68,iVar1);
    }
  }
  Gia_ManAppendCo(p,local_68);
  pGVar9 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  Vec_IntFree(vTemp_00);
  return pGVar9;
}

Assistant:

Gia_Man_t * Abc_NtkFinMiterToGia( Abc_Ntk_t * pNtk, Vec_Int_t * vTypes, Vec_Int_t * vCos, Vec_Int_t * vCis, Vec_Int_t * vNodes, 
                                  int iObjs[2], int Types[2], Vec_Int_t * vLits )
{
    Gia_Man_t * pNew = NULL, * pTemp;
    Abc_Obj_t * pObj; 
    Vec_Int_t * vTemp = Vec_IntAlloc( 100 );
    int n, i, Type, iMiter, iLit, * pLits;
    // create AIG manager
    pNew = Gia_ManStart( 1000 );
    pNew->pName = Abc_UtilStrsav( pNtk->pName );
    pNew->pSpec = Abc_UtilStrsav( pNtk->pSpec );
    Gia_ManHashStart( pNew );
    // create inputs
    Abc_NtkForEachObjVec( vCis, pNtk, pObj, i )
    {
        iLit = Gia_ManAppendCi(pNew);
        for ( n = 0; n < 2; n++ )
        {
            if ( iObjs[n] != (int)Abc_ObjId(pObj) )
                Vec_IntWriteEntry( vLits, Abc_Var2Lit(Abc_ObjId(pObj), n), iLit );
            else if ( Types[n] != ABC_FIN_NEG )
                Vec_IntWriteEntry( vLits, Abc_Var2Lit(Abc_ObjId(pObj), n), Abc_NtkFinSimOneLit(pNew, pObj, Types[n], vLits, n, vTemp) );
            else // if ( iObjs[n] == (int)Abc_ObjId(pObj) && Types[n] == ABC_FIN_NEG )
                Vec_IntWriteEntry( vLits, Abc_Var2Lit(Abc_ObjId(pObj), n), Abc_LitNot(iLit) );
        }
    }
    // create internal nodes
    Abc_NtkForEachObjVec( vNodes, pNtk, pObj, i )
    {
        Type = Abc_NtkIsMappedLogic(pNtk) ? Mio_GateReadCell((Mio_Gate_t *)pObj->pData) : Vec_IntEntry(vTypes, Abc_ObjId(pObj));
        for ( n = 0; n < 2; n++ )
        {
            if ( iObjs[n] != (int)Abc_ObjId(pObj) )
                Vec_IntWriteEntry( vLits, Abc_Var2Lit(Abc_ObjId(pObj), n), Abc_NtkFinSimOneLit(pNew, pObj, Type, vLits, n, vTemp) );
            else if ( Types[n] != ABC_FIN_NEG )
                Vec_IntWriteEntry( vLits, Abc_Var2Lit(Abc_ObjId(pObj), n), Abc_NtkFinSimOneLit(pNew, pObj, Types[n], vLits, n, vTemp) );
            else // if ( iObjs[n] == (int)Abc_ObjId(pObj) && Types[n] == ABC_FIN_NEG )
                Vec_IntWriteEntry( vLits, Abc_Var2Lit(Abc_ObjId(pObj), n), Abc_LitNot(Abc_NtkFinSimOneLit(pNew, pObj, Type, vLits, n, vTemp)) );
        }
    }
    // create comparator
    iMiter = 0;
    Abc_NtkForEachObjVec( vCos, pNtk, pObj, i )
    {
        pLits  = Vec_IntEntryP( vLits, Abc_Var2Lit(Abc_ObjFaninId0(pObj), 0) );
        iLit   = Gia_ManHashXor( pNew, pLits[0], pLits[1] );
        iMiter = Gia_ManHashOr( pNew, iMiter, iLit );
    }
    Gia_ManAppendCo( pNew, iMiter );
    // perform cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    Vec_IntFree( vTemp );
    return pNew;
}